

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_quat.cpp
# Opt level: O2

quaternion get_conjugate(quaternion *in_quat1)

{
  ostream *poVar1;
  quaternion qVar2;
  
  if (in_quat1 == (quaternion *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"get_conjugate");
    std::operator<<(poVar1,": Invalid input.\n");
    qVar2 = (quaternion)ZEXT816(0);
  }
  else {
    qVar2 = operator!(in_quat1);
  }
  return qVar2;
}

Assistant:

quaternion get_conjugate(const quaternion *in_quat1) {
    if (!in_quat1) {
        std::cerr << __func__ << ": Invalid input.\n";
        return {0.f};
    }

    return !(*in_quat1);
}